

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqapi.cpp
# Opt level: O3

SQRESULT sq_resume(HSQUIRRELVM v,SQBool retval,SQBool raiseerror)

{
  SQInteger stackbase;
  bool bVar1;
  SQObjectPtr *pSVar2;
  SQObjectPtr *outres;
  SQRESULT SVar3;
  
  SVar3 = -1;
  pSVar2 = SQVM::GetUp(v,-1);
  if ((pSVar2->super_SQObject)._type == OT_GENERATOR) {
    SQVM::PushNull(v);
    pSVar2 = SQVM::GetUp(v,-2);
    stackbase = v->_top;
    SVar3 = -1;
    outres = SQVM::GetUp(v,-1);
    bVar1 = SQVM::Execute(v,pSVar2,0,stackbase,outres,raiseerror,ET_RESUME_GENERATOR);
    if (bVar1) {
      if (retval == 0) {
        SQVM::Pop(v);
      }
      SVar3 = 0;
    }
    else {
      SQVM::Raise_Error(v,&v->_lasterror);
    }
  }
  else {
    sq_throwerror(v,"only generators can be resumed");
  }
  return SVar3;
}

Assistant:

SQRESULT sq_resume(HSQUIRRELVM v,SQBool retval,SQBool raiseerror)
{
    if (type(v->GetUp(-1)) == OT_GENERATOR)
    {
        v->PushNull(); //retval
        if (!v->Execute(v->GetUp(-2), 0, v->_top, v->GetUp(-1), raiseerror, SQVM::ET_RESUME_GENERATOR))
        {v->Raise_Error(v->_lasterror); return SQ_ERROR;}
        if(!retval)
            v->Pop();
        return SQ_OK;
    }
    return sq_throwerror(v,_SC("only generators can be resumed"));
}